

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccolor.c
# Opt level: O2

void null_convert(j_compress_ptr cinfo,JSAMPARRAY input_buf,JSAMPIMAGE output_buf,
                 JDIMENSION output_row,int num_rows)

{
  uint uVar1;
  uint uVar2;
  JSAMPROW pJVar3;
  ulong uVar4;
  ulong uVar5;
  JSAMPLE *pJVar6;
  ulong uVar7;
  
  uVar1 = cinfo->num_components;
  uVar2 = cinfo->image_width;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  while (0 < num_rows) {
    num_rows = num_rows + -1;
    for (uVar5 = 0; uVar5 != uVar4; uVar5 = uVar5 + 1) {
      pJVar3 = output_buf[uVar5][output_row];
      pJVar6 = *input_buf + uVar5;
      for (uVar7 = 0; uVar2 != uVar7; uVar7 = uVar7 + 1) {
        pJVar3[uVar7] = *pJVar6;
        pJVar6 = pJVar6 + (int)uVar1;
      }
    }
    input_buf = input_buf + 1;
    output_row = output_row + 1;
  }
  return;
}

Assistant:

METHODDEF(void)
null_convert (j_compress_ptr cinfo,
	      JSAMPARRAY input_buf, JSAMPIMAGE output_buf,
	      JDIMENSION output_row, int num_rows)
{
  register JSAMPROW inptr;
  register JSAMPROW outptr;
  register JDIMENSION col;
  register int ci;
  int nc = cinfo->num_components;
  JDIMENSION num_cols = cinfo->image_width;

  while (--num_rows >= 0) {
    /* It seems fastest to make a separate pass for each component. */
    for (ci = 0; ci < nc; ci++) {
      inptr = *input_buf;
      outptr = output_buf[ci][output_row];
      for (col = 0; col < num_cols; col++) {
	outptr[col] = inptr[ci]; /* don't need GETJSAMPLE() here */
	inptr += nc;
      }
    }
    input_buf++;
    output_row++;
  }
}